

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::importmulti(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCArg> __l_04;
  initializer_list<RPCArg> __l_05;
  initializer_list<RPCArg> __l_06;
  initializer_list<RPCResult> __l_07;
  initializer_list<RPCResult> __l_08;
  initializer_list<RPCResult> __l_09;
  initializer_list<RPCResult> __l_10;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffc8f8;
  allocator<RPCArg> *paVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffc900;
  string *in_stack_ffffffffffffc908;
  undefined4 in_stack_ffffffffffffc910;
  VType in_stack_ffffffffffffc914;
  UniValue *in_stack_ffffffffffffc918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc930;
  UniValue *in_stack_ffffffffffffc938;
  UniValue *in_stack_ffffffffffffc940;
  undefined7 in_stack_ffffffffffffc948;
  undefined1 in_stack_ffffffffffffc94f;
  string *in_stack_ffffffffffffc950;
  undefined7 in_stack_ffffffffffffc958;
  undefined1 in_stack_ffffffffffffc95f;
  undefined4 in_stack_ffffffffffffc960;
  Type in_stack_ffffffffffffc964;
  string *in_stack_ffffffffffffc968;
  undefined4 in_stack_ffffffffffffc970;
  Type in_stack_ffffffffffffc974;
  undefined4 in_stack_ffffffffffffc978;
  Type in_stack_ffffffffffffc97c;
  RPCArg *in_stack_ffffffffffffc980;
  RPCArgOptions *in_stack_ffffffffffffc9a0;
  RPCExamples *in_stack_ffffffffffffca40;
  RPCResults *in_stack_ffffffffffffca48;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffca50;
  string *in_stack_ffffffffffffca58;
  string *in_stack_ffffffffffffca60;
  RPCHelpMan *in_stack_ffffffffffffca68;
  undefined1 *local_3500;
  undefined1 *local_34e8;
  undefined1 *local_34d0;
  undefined1 *local_34b8;
  RPCMethodImpl *in_stack_ffffffffffffcb60;
  undefined1 *local_3488;
  undefined1 *local_3470;
  undefined1 *local_3458;
  undefined1 *local_3440;
  undefined1 *local_3428;
  undefined1 *local_3410;
  undefined1 *local_33f8;
  undefined1 local_2f30 [34];
  allocator<char> local_2f0e;
  allocator<char> local_2f0d;
  allocator<char> local_2f0c [4];
  pointer local_2f08;
  pointer pRStack_2f00;
  pointer local_2ef8;
  allocator<char> local_2eea;
  allocator<char> local_2ee9 [30];
  allocator<char> local_2ecb;
  allocator<char> local_2eca [32];
  allocator<char> local_2eaa;
  allocator<char> local_2ea9 [31];
  allocator<char> local_2e8a;
  allocator<char> local_2e89;
  size_type local_2e88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2e80;
  allocator<char> local_2e6a;
  allocator<char> local_2e69 [31];
  allocator<char> local_2e4a;
  allocator<char> local_2e49 [31];
  allocator<char> local_2e2a;
  allocator<char> local_2e29 [28];
  allocator<char> local_2e0d [2];
  allocator<char> local_2e0b;
  undefined1 local_2e0a;
  allocator<char> local_2e09 [28];
  allocator<char> local_2ded;
  undefined4 local_2dec;
  allocator<char> local_2de8;
  allocator<char> local_2de7 [3];
  allocator<char> local_2de4;
  undefined1 local_2de3;
  allocator<char> local_2de2;
  allocator<char> local_2de1;
  allocator<char> local_2de0;
  allocator<char> local_2ddf;
  undefined1 local_2dde;
  allocator<char> local_2ddd;
  allocator<char> local_2ddc;
  undefined1 local_2ddb;
  allocator<char> local_2dda;
  allocator<char> local_2dd9;
  undefined4 local_2dd8;
  allocator<char> local_2dd3 [2];
  allocator<char> local_2dd1;
  undefined4 local_2dd0;
  allocator<char> local_2dc9 [29];
  allocator<char> local_2dac;
  allocator<char> local_2dab [2];
  allocator<char> local_2da9;
  undefined4 local_2da8;
  allocator<char> local_2da1 [26];
  allocator<char> local_2d87;
  allocator<char> local_2d86;
  allocator<char> local_2d85;
  undefined4 local_2d84;
  allocator<char> local_2d7e;
  allocator<char> local_2d7d;
  undefined4 local_2d7c;
  allocator<char> local_2d78 [2];
  allocator<char> local_2d76;
  allocator<char> local_2d75;
  undefined4 local_2d74;
  allocator<char> local_2d6d [2];
  allocator<char> local_2d6b;
  allocator<char> local_2d6a;
  allocator<char> local_2d69;
  undefined4 local_2d68;
  allocator<char> local_2d62;
  allocator<char> local_2d61;
  undefined4 local_2d60;
  allocator<char> local_2d59 [32];
  allocator<char> local_2d39;
  undefined4 local_2d38;
  allocator<char> local_2d31 [32];
  allocator<char> local_2d11;
  undefined4 local_2d10;
  allocator<char> local_2d09 [31];
  allocator<char> local_2cea;
  allocator<char> local_2ce9 [321];
  undefined1 local_2ba8 [136];
  undefined1 local_2b20 [128];
  undefined1 local_2aa0 [136];
  undefined1 local_2a18 [128];
  undefined1 local_2998 [408];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [136];
  undefined1 local_2738 [200];
  allocator<RPCArg> local_2670 [40];
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined8 local_2638;
  undefined1 local_2630;
  undefined1 local_262f;
  undefined1 local_2628;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined1 local_25e8;
  undefined1 local_25e7;
  undefined1 local_24e8 [264];
  undefined1 local_23e0 [160];
  allocator<RPCArg> local_2340 [40];
  undefined8 local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined1 local_2300;
  undefined1 local_22ff;
  allocator<RPCArg> local_22f8 [40];
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined1 local_22b8;
  undefined1 local_22b7;
  undefined1 local_22b0;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined1 local_2270;
  undefined1 local_226f;
  undefined1 local_2170;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined1 local_2130;
  undefined1 local_212f;
  undefined1 local_2030;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined1 local_1ff0;
  undefined1 local_1fef;
  undefined1 local_1ef0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined1 local_1eb0;
  undefined1 local_1eaf;
  undefined1 local_1db0;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined1 local_1d70;
  undefined1 local_1d6f;
  allocator<RPCArg> local_1cc8 [40];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined1 local_1c88;
  undefined1 local_1c87;
  undefined1 local_1c80;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined1 local_1c40;
  undefined1 local_1c3f;
  undefined1 local_1b98 [264];
  undefined1 local_1a90 [280];
  allocator<RPCArg> local_1978 [40];
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined1 local_1938;
  undefined1 local_1937;
  undefined1 local_1930;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined1 local_18f0;
  undefined1 local_18ef;
  undefined1 local_1848 [264];
  undefined1 local_1740 [280];
  undefined1 local_1628;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined1 local_15e8;
  undefined1 local_15e7;
  undefined1 local_1540;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined1 local_1500;
  undefined1 local_14ff;
  undefined1 local_1458 [64];
  undefined1 local_1418 [64];
  undefined1 local_13d8;
  undefined1 local_13d7;
  undefined1 local_1310 [64];
  undefined1 local_12d0 [64];
  undefined1 local_1290;
  undefined1 local_128f;
  undefined1 local_11e8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined1 local_11a8;
  undefined1 local_11a7;
  undefined1 local_1100 [256];
  undefined8 local_1000;
  undefined1 local_4a0 [160];
  undefined1 local_400 [264];
  undefined1 local_2f8 [160];
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  uStack_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d10 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d38 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d60 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_11e8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_11c0 = 0;
  uStack_11b8 = 0;
  local_11b0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc8f8);
  local_11a8 = 0;
  local_11a7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d68 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_12d0[0] = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffc8f8);
  __l._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l._M_array = (iterator)in_stack_ffffffffffffc940;
  __l._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc938,__l,(allocator_type *)in_stack_ffffffffffffc930);
  local_1290 = 0;
  local_128f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d74 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffc940);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910),
                 (char *)in_stack_ffffffffffffc908);
  local_1418[0] = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffc8f8);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_00._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc938,__l_00,(allocator_type *)in_stack_ffffffffffffc930);
  local_13d8 = 0;
  local_13d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d7c = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1540 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1518 = 0;
  uStack_1510 = 0;
  local_1508 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc8f8);
  local_1500 = 0;
  local_14ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2d84 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1628 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1600 = 0;
  uStack_15f8 = 0;
  local_15f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc8f8);
  local_15e8 = 0;
  local_15e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  UniValue::UniValue(in_stack_ffffffffffffc918,in_stack_ffffffffffffc914,in_stack_ffffffffffffc908);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2da8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1930 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1908 = 0;
  uStack_1900 = 0;
  local_18f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc8f8);
  local_18f0 = 0;
  local_18ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffc8f8);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_01._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_01,
             (allocator_type *)in_stack_ffffffffffffc930);
  local_1978[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1950 = 0;
  uStack_1948 = 0;
  local_1940 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc8f8);
  local_1938 = 0;
  local_1937 = 0;
  paVar2 = local_1978;
  RPCArg::RPCArg(in_stack_ffffffffffffc980,
                 (string *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
                 in_stack_ffffffffffffc974,(Fallback *)in_stack_ffffffffffffc968,
                 (string *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  UniValue::UniValue(in_stack_ffffffffffffc918,in_stack_ffffffffffffc914,in_stack_ffffffffffffc908);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2dd0 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1c80 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1c58 = 0;
  uStack_1c50 = 0;
  local_1c48 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1c40 = 0;
  local_1c3f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_02._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_02,
             (allocator_type *)in_stack_ffffffffffffc930);
  local_1cc8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1ca0 = 0;
  uStack_1c98 = 0;
  local_1c90 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1c88 = 0;
  local_1c87 = 0;
  paVar2 = local_1cc8;
  RPCArg::RPCArg(in_stack_ffffffffffffc980,
                 (string *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
                 in_stack_ffffffffffffc974,(Fallback *)in_stack_ffffffffffffc968,
                 (string *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2dd8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1db0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1d88 = 0;
  uStack_1d80 = 0;
  local_1d78 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1d70 = 0;
  local_1d6f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2ddb = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc938,(bool *)in_stack_ffffffffffffc930);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_1ef0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_1ec8 = 0;
  uStack_1ec0 = 0;
  local_1eb8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1eb0 = 0;
  local_1eaf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2dde = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc938,(bool *)in_stack_ffffffffffffc930);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2030 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_2008 = 0;
  uStack_2000 = 0;
  local_1ff8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1ff0 = 0;
  local_1fef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            (in_stack_ffffffffffffc940,(char (*) [1])in_stack_ffffffffffffc938);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2170 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_2148 = 0;
  uStack_2140 = 0;
  local_2138 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2130 = 0;
  local_212f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2de3 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc938,(bool *)in_stack_ffffffffffffc930);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_22b0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_2288 = 0;
  uStack_2280 = 0;
  local_2278 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2270 = 0;
  local_226f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_03._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_03,
             (allocator_type *)in_stack_ffffffffffffc930);
  local_22f8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_22d0 = 0;
  uStack_22c8 = 0;
  local_22c0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_22b8 = 0;
  local_22b7 = 0;
  paVar2 = local_22f8;
  RPCArg::RPCArg(in_stack_ffffffffffffc980,
                 (string *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
                 in_stack_ffffffffffffc974,(Fallback *)in_stack_ffffffffffffc968,
                 (string *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc9a0);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_04._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_04,
             (allocator_type *)in_stack_ffffffffffffc930);
  local_2340[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2318 = 0;
  uStack_2310 = 0;
  local_2308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2300 = 0;
  local_22ff = 0;
  paVar2 = local_2340;
  RPCArg::RPCArg(in_stack_ffffffffffffc980,
                 (string *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
                 in_stack_ffffffffffffc974,(Fallback *)in_stack_ffffffffffffc968,
                 (string *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc9a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2dec = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,&in_stack_ffffffffffffc900->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2e0a = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffc938,(bool *)in_stack_ffffffffffffc930);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc908,in_stack_ffffffffffffc900);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2628 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc914,in_stack_ffffffffffffc910));
  local_2600 = 0;
  uStack_25f8 = 0;
  local_25f0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_25e8 = 0;
  local_25e7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
                 in_stack_ffffffffffffc968,in_stack_ffffffffffffc964,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc950,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_05._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_05,
             (allocator_type *)in_stack_ffffffffffffc930);
  local_2670[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2648 = 0;
  uStack_2640 = 0;
  local_2638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_2630 = 0;
  local_262f = 0;
  paVar2 = local_2670;
  RPCArg::RPCArg(in_stack_ffffffffffffc980,
                 (string *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
                 in_stack_ffffffffffffc974,(Fallback *)in_stack_ffffffffffffc968,
                 (string *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
                 in_stack_ffffffffffffc9a0);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_06._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc938,__l_06,
             (allocator_type *)in_stack_ffffffffffffc930);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2e88 = 0;
  aStack_2e80._M_allocated_capacity = 0;
  aStack_2e80._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c,
             (string *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
             in_stack_ffffffffffffc968,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (bool)in_stack_ffffffffffffc95f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2eca[2] = (allocator<char>)0x0;
  local_2eca[3] = (allocator<char>)0x0;
  local_2eca[4] = (allocator<char>)0x0;
  local_2eca[5] = (allocator<char>)0x0;
  local_2eca[6] = (allocator<char>)0x0;
  local_2eca[7] = (allocator<char>)0x0;
  local_2eca[8] = (allocator<char>)0x0;
  local_2eca[9] = (allocator<char>)0x0;
  local_2eca[10] = (allocator<char>)0x0;
  local_2eca[0xb] = (allocator<char>)0x0;
  local_2eca[0xc] = (allocator<char>)0x0;
  local_2eca[0xd] = (allocator<char>)0x0;
  local_2eca[0xe] = (allocator<char>)0x0;
  local_2eca[0xf] = (allocator<char>)0x0;
  local_2eca[0x10] = (allocator<char>)0x0;
  local_2eca[0x11] = (allocator<char>)0x0;
  local_2eca[0x12] = (allocator<char>)0x0;
  local_2eca[0x13] = (allocator<char>)0x0;
  local_2eca[0x14] = (allocator<char>)0x0;
  local_2eca[0x15] = (allocator<char>)0x0;
  local_2eca[0x16] = (allocator<char>)0x0;
  local_2eca[0x17] = (allocator<char>)0x0;
  local_2eca[0x18] = (allocator<char>)0x0;
  local_2eca[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c,
             (string *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
             in_stack_ffffffffffffc968,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (bool)in_stack_ffffffffffffc95f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_07._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_07._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_07._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc938,__l_07,
             (allocator_type *)in_stack_ffffffffffffc930);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
             in_stack_ffffffffffffc974,in_stack_ffffffffffffc968,
             SUB41(in_stack_ffffffffffffc964 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc950,
             (bool)in_stack_ffffffffffffc94f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  local_2f08 = (pointer)0x0;
  pRStack_2f00 = (pointer)0x0;
  local_2ef8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c,
             (string *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
             in_stack_ffffffffffffc968,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (bool)in_stack_ffffffffffffc95f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_08._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_08._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_08._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc938,__l_08,
             (allocator_type *)in_stack_ffffffffffffc930);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
             in_stack_ffffffffffffc974,in_stack_ffffffffffffc968,
             SUB41(in_stack_ffffffffffffc964 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffc95f,in_stack_ffffffffffffc958),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc950,
             (bool)in_stack_ffffffffffffc94f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_09._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_09._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_09._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc938,__l_09,
             (allocator_type *)in_stack_ffffffffffffc930);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c,
             (string *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
             in_stack_ffffffffffffc968,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (bool)in_stack_ffffffffffffc95f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_10._M_len._0_7_ = in_stack_ffffffffffffc948;
  __l_10._M_array = (iterator)in_stack_ffffffffffffc940;
  __l_10._M_len._7_1_ = in_stack_ffffffffffffc94f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc938,__l_10,
             (allocator_type *)in_stack_ffffffffffffc930);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffc980,in_stack_ffffffffffffc97c,
             (string *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970),
             in_stack_ffffffffffffc968,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (bool)in_stack_ffffffffffffc95f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffc97c,in_stack_ffffffffffffc978),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffc974,in_stack_ffffffffffffc970));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  HelpExampleCli(in_stack_ffffffffffffc930,in_stack_ffffffffffffc928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffc94f,in_stack_ffffffffffffc948),
             (char *)in_stack_ffffffffffffc940,(allocator<char> *)in_stack_ffffffffffffc938);
  HelpExampleCli(in_stack_ffffffffffffc930,in_stack_ffffffffffffc928);
  std::operator+(in_stack_ffffffffffffc930,in_stack_ffffffffffffc928);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x4e5b5c);
  this = (RPCArg *)local_2f30;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::importmulti()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffc908,(anon_class_1_0_00000001 *)in_stack_ffffffffffffc900);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffca68,in_stack_ffffffffffffca60,in_stack_ffffffffffffca58,
             in_stack_ffffffffffffca50,in_stack_ffffffffffffca48,in_stack_ffffffffffffca40,
             in_stack_ffffffffffffcb60);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2f30 + 0x21));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f0e);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f0d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2f0c);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_33f8 = local_2738;
  do {
    local_33f8 = local_33f8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_33f8 != local_27c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_3410 = local_2800;
  do {
    local_3410 = local_3410 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_3410 != local_2998);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_3428 = local_2b20;
  do {
    local_3428 = local_3428 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_3428 != local_2ba8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2eea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2ee9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ecb);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2eca);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_3440 = local_2a18;
  do {
    local_3440 = local_3440 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_3440 != local_2aa0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2eaa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2ea9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc908);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2e69);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2e49);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2e29);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3458 = local_48;
  do {
    local_3458 = local_3458 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3458 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<char>::~allocator(local_2e0d);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3470 = local_23e0;
  do {
    local_3470 = local_3470 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3470 != local_24e8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e0b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2e09);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ded);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2de8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<char>::~allocator(local_2de7);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3488 = local_2f8;
  do {
    local_3488 = local_3488 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3488 != local_400);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar1 = local_4a0;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != local_1100);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2de4);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2de2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2de1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2de0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ddf);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ddd);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ddc);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dda);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dd9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2dd3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_34b8 = local_1a90;
  do {
    local_34b8 = local_34b8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_34b8 != local_1b98);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dd1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2dc9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dac);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2dab);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc908);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_34d0 = local_1740;
  do {
    local_34d0 = local_34d0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_34d0 != local_1848);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2da9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2da1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d87);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d86);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d85);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d7e);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d7d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d78);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  local_34e8 = local_1418;
  do {
    local_34e8 = local_34e8 + -0x20;
    std::__cxx11::string::~string(&this->m_names);
  } while (local_34e8 != local_1458);
  std::allocator<char>::~allocator(&local_2d76);
  std::allocator<char>::~allocator(&local_2d75);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d6d);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  local_3500 = local_12d0;
  do {
    local_3500 = local_3500 + -0x20;
    std::__cxx11::string::~string(&this->m_names);
  } while (local_3500 != local_1310);
  std::allocator<char>::~allocator(&local_2d6b);
  std::allocator<char>::~allocator(&local_2d6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d69);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d62);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d61);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d39);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d31);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d11);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d09);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2ce9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importmulti()
{
    return RPCHelpMan{"importmulti",
                "\nImport addresses/scripts (with private or public keys, redeem script (P2SH)), optionally rescanning the blockchain from the earliest creation time of the imported scripts. Requires a new wallet backup.\n"
                "If an address/script is imported without all of the private keys required to spend from that address, it will be watchonly. The 'watchonly' option must be set to true in this case or a warning will be returned.\n"
                "Conversely, if all the private keys are provided and the address/script is spendable, the watchonly option must be set to false, or a warning will be returned.\n"
            "\nNote: This call can take over an hour to complete if rescan is true, during that time, other rpc calls\n"
            "may report that the imported keys, addresses or scripts exist but related transactions are still missing.\n"
            "The rescan parameter can be set to false if the key was never used to create transactions. If it is set to false,\n"
            "but the key was used to create transactions, rescanblockchain needs to be called with the appropriate block range.\n"
            "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
            "Note: This command is only compatible with legacy wallets. Use \"importdescriptors\" for descriptor wallets.\n",
                {
                    {"requests", RPCArg::Type::ARR, RPCArg::Optional::NO, "Data to be imported",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"desc", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Descriptor to import. If using descriptor, do not also provide address/scriptPubKey, scripts, or pubkeys"},
                                    {"scriptPubKey", RPCArg::Type::STR, RPCArg::Optional::NO, "Type of scriptPubKey (string for script, json for address). Should not be provided if using a descriptor",
                                        RPCArgOptions{.type_str={"\"<script>\" | { \"address\":\"<address>\" }", "string / json"}}
                                    },
                                    {"timestamp", RPCArg::Type::NUM, RPCArg::Optional::NO, "Creation time of the key expressed in " + UNIX_EPOCH_TIME + ",\n"
                                        "or the string \"now\" to substitute the current synced blockchain time. The timestamp of the oldest\n"
                                        "key will determine how far back blockchain rescans need to begin for missing wallet transactions.\n"
                                        "\"now\" can be specified to bypass scanning, for keys which are known to never have been used, and\n"
                                        "0 can be specified to scan the entire blockchain. Blocks up to 2 hours before the earliest key\n"
                                        "creation time of all keys being imported by the importmulti call will be scanned.",
                                        RPCArgOptions{.type_str={"timestamp | \"now\"", "integer / string"}}
                                    },
                                    {"redeemscript", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Allowed only if the scriptPubKey is a P2SH or P2SH-P2WSH address/scriptPubKey"},
                                    {"witnessscript", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Allowed only if the scriptPubKey is a P2SH-P2WSH or P2WSH address/scriptPubKey"},
                                    {"pubkeys", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Array of strings giving pubkeys to import. They must occur in P2PKH or P2WPKH scripts. They are not required when the private key is also provided (see the \"keys\" argument).",
                                        {
                                            {"pubKey", RPCArg::Type::STR, RPCArg::Optional::OMITTED, ""},
                                        }
                                    },
                                    {"keys", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Array of strings giving private keys to import. The corresponding public keys must occur in the output or redeemscript.",
                                        {
                                            {"key", RPCArg::Type::STR, RPCArg::Optional::OMITTED, ""},
                                        }
                                    },
                                    {"range", RPCArg::Type::RANGE, RPCArg::Optional::OMITTED, "If a ranged descriptor is used, this specifies the end or the range (in the form [begin,end]) to import"},
                                    {"internal", RPCArg::Type::BOOL, RPCArg::Default{false}, "Stating whether matching outputs should be treated as not incoming payments (also known as change)"},
                                    {"watchonly", RPCArg::Type::BOOL, RPCArg::Default{false}, "Stating whether matching outputs should be considered watchonly."},
                                    {"label", RPCArg::Type::STR, RPCArg::Default{""}, "Label to assign to the address, only allowed with internal=false"},
                                    {"keypool", RPCArg::Type::BOOL, RPCArg::Default{false}, "Stating whether imported public keys should be added to the keypool for when users request new addresses. Only allowed when wallet private keys are disabled"},
                                },
                            },
                        },
                        RPCArgOptions{.oneline_description="requests"}},
                    {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                        {
                            {"rescan", RPCArg::Type::BOOL, RPCArg::Default{true}, "Scan the chain and mempool for wallet transactions after all imports."},
                        },
                        RPCArgOptions{.oneline_description="options"}},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "Response is an array with the same size as the input that has the execution result",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "success", ""},
                            {RPCResult::Type::ARR, "warnings", /*optional=*/true, "",
                            {
                                {RPCResult::Type::STR, "", ""},
                            }},
                            {RPCResult::Type::OBJ, "error", /*optional=*/true, "",
                            {
                                {RPCResult::Type::ELISION, "", "JSONRPC error"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("importmulti", "'[{ \"scriptPubKey\": { \"address\": \"<my address>\" }, \"timestamp\":1455191478 }, "
                                          "{ \"scriptPubKey\": { \"address\": \"<my 2nd address>\" }, \"label\": \"example 2\", \"timestamp\": 1455191480 }]'") +
                    HelpExampleCli("importmulti", "'[{ \"scriptPubKey\": { \"address\": \"<my address>\" }, \"timestamp\":1455191478 }]' '{ \"rescan\": false}'")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& mainRequest) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(mainRequest);
    if (!pwallet) return UniValue::VNULL;
    CWallet& wallet{*pwallet};

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    const UniValue& requests = mainRequest.params[0];

    //Default options
    bool fRescan = true;

    if (!mainRequest.params[1].isNull()) {
        const UniValue& options = mainRequest.params[1];

        if (options.exists("rescan")) {
            fRescan = options["rescan"].get_bool();
        }
    }

    WalletRescanReserver reserver(*pwallet);
    if (fRescan && !reserver.reserve()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
    }

    int64_t now = 0;
    bool fRunScan = false;
    int64_t nLowestTimestamp = 0;
    UniValue response(UniValue::VARR);
    {
        LOCK(pwallet->cs_wallet);

        // Check all requests are watchonly
        bool is_watchonly{true};
        for (size_t i = 0; i < requests.size(); ++i) {
            const UniValue& request = requests[i];
            if (!request.exists("watchonly") || !request["watchonly"].get_bool()) {
                is_watchonly = false;
                break;
            }
        }
        // Wallet does not need to be unlocked if all requests are watchonly
        if (!is_watchonly) EnsureWalletIsUnlocked(wallet);

        // Verify all timestamps are present before importing any keys.
        CHECK_NONFATAL(pwallet->chain().findBlock(pwallet->GetLastBlockHash(), FoundBlock().time(nLowestTimestamp).mtpTime(now)));
        for (const UniValue& data : requests.getValues()) {
            GetImportTimestamp(data, now);
        }

        const int64_t minimumTimestamp = 1;

        for (const UniValue& data : requests.getValues()) {
            const int64_t timestamp = std::max(GetImportTimestamp(data, now), minimumTimestamp);
            const UniValue result = ProcessImport(*pwallet, data, timestamp);
            response.push_back(result);

            if (!fRescan) {
                continue;
            }

            // If at least one request was successful then allow rescan.
            if (result["success"].get_bool()) {
                fRunScan = true;
            }

            // Get the lowest timestamp.
            if (timestamp < nLowestTimestamp) {
                nLowestTimestamp = timestamp;
            }
        }
    }
    if (fRescan && fRunScan && requests.size()) {
        int64_t scannedTime = pwallet->RescanFromTime(nLowestTimestamp, reserver, /*update=*/true);
        pwallet->ResubmitWalletTransactions(/*relay=*/false, /*force=*/true);

        if (pwallet->IsAbortingRescan()) {
            throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted by user.");
        }
        if (scannedTime > nLowestTimestamp) {
            std::vector<UniValue> results = response.getValues();
            response.clear();
            response.setArray();
            size_t i = 0;
            for (const UniValue& request : requests.getValues()) {
                // If key creation date is within the successfully scanned
                // range, or if the import result already has an error set, let
                // the result stand unmodified. Otherwise replace the result
                // with an error message.
                if (scannedTime <= GetImportTimestamp(request, now) || results.at(i).exists("error")) {
                    response.push_back(results.at(i));
                } else {
                    UniValue result = UniValue(UniValue::VOBJ);
                    result.pushKV("success", UniValue(false));
                    result.pushKV(
                        "error",
                        JSONRPCError(
                            RPC_MISC_ERROR,
                            strprintf("Rescan failed for key with creation timestamp %d. There was an error reading a "
                                      "block from time %d, which is after or within %d seconds of key creation, and "
                                      "could contain transactions pertaining to the key. As a result, transactions "
                                      "and coins using this key may not appear in the wallet. This error could be "
                                      "caused by pruning or data corruption (see bitcoind log for details) and could "
                                      "be dealt with by downloading and rescanning the relevant blocks (see -reindex "
                                      "option and rescanblockchain RPC).",
                                GetImportTimestamp(request, now), scannedTime - TIMESTAMP_WINDOW - 1, TIMESTAMP_WINDOW)));
                    response.push_back(std::move(result));
                }
                ++i;
            }
        }
    }

    return response;
},
    };
}